

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int key_schedule_extract(st_ptls_key_schedule_t *sched,ptls_iovec_t ikm)

{
  int iVar1;
  size_t sVar2;
  uint8_t *puVar3;
  ptls_iovec_t salt;
  ptls_iovec_t ikm_00;
  
  sVar2 = ikm.len;
  puVar3 = ikm.base;
  if (puVar3 == (uint8_t *)0x0) {
    sVar2 = sched->algo->digest_size;
    puVar3 = zeroes_of_max_digest_size;
  }
  sched->generation = sched->generation + 1;
  salt.base = sched->secret;
  salt.len = sched->algo->digest_size;
  ikm_00.len = sVar2;
  ikm_00.base = puVar3;
  iVar1 = ptls_hkdf_extract(sched->algo,salt.base,salt,ikm_00);
  return iVar1;
}

Assistant:

static int key_schedule_extract(struct st_ptls_key_schedule_t *sched, ptls_iovec_t ikm)
{
    if (ikm.base == NULL)
        ikm = ptls_iovec_init(zeroes_of_max_digest_size, sched->algo->digest_size);

    ++sched->generation;
    int ret = ptls_hkdf_extract(sched->algo, sched->secret, ptls_iovec_init(sched->secret, sched->algo->digest_size), ikm);
    PTLS_DEBUGF("%s: %u, %02x%02x\n", __FUNCTION__, sched->generation, (int)sched->secret[0], (int)sched->secret[1]);
    return ret;
}